

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LSM_tree.cpp
# Opt level: O2

bool __thiscall LSM_tree::find(LSM_tree *this,uint64_t key)

{
  pointer ppLVar1;
  bool bVar2;
  bool bVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  bool del;
  int id;
  Level level;
  string result;
  Sstable sstable;
  bool local_cd;
  int local_cc;
  LSM_tree *local_c8;
  ulong local_c0;
  pairs local_b8;
  Level local_98;
  string local_70;
  Sstable local_50;
  
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_cd = false;
  local_c8 = this;
  bVar2 = Skiplist::has_key(&this->memtable,key,&local_cd,&local_70);
  bVar4 = local_cd;
  if (!bVar2) {
    uVar7 = 0;
    bVar2 = false;
    uVar6 = 0;
    uVar5 = 0;
    while( true ) {
      ppLVar1 = (local_c8->disk).super__Vector_base<Level_*,_std::allocator<Level_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((ulong)((long)(local_c8->disk).super__Vector_base<Level_*,_std::allocator<Level_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)ppLVar1 >> 3) <= uVar7)
      break;
      local_c0 = uVar7;
      Level::Level(&local_98,ppLVar1[uVar7]);
      for (uVar7 = 0;
          uVar7 < (ulong)((long)local_98.file.
                                super__Vector_base<Sstable_*,_std::allocator<Sstable_*>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                          (long)local_98.file.
                                super__Vector_base<Sstable_*,_std::allocator<Sstable_*>_>._M_impl.
                                super__Vector_impl_data._M_start >> 3); uVar7 = uVar7 + 1) {
        if (local_98.file.super__Vector_base<Sstable_*,_std::allocator<Sstable_*>_>._M_impl.
            super__Vector_impl_data._M_start[uVar7] != (Sstable *)0x0) {
          Sstable::Sstable(&local_50,
                           local_98.file.super__Vector_base<Sstable_*,_std::allocator<Sstable_*>_>.
                           _M_impl.super__Vector_impl_data._M_start[uVar7]);
          local_b8.key = 0;
          local_b8.offset = 0;
          local_b8.timer = 0;
          local_b8._16_4_ = local_b8._16_4_ & 0xffffff00;
          local_cc = 0;
          bVar3 = Sstable::find(&local_50,key,&local_b8,&local_cc);
          if (bVar3) {
            uVar5 = uVar5 & 0xff;
            if (uVar6 < local_b8.timer) {
              uVar6 = local_b8.timer;
              uVar5 = local_b8._16_4_;
            }
            bVar2 = true;
          }
          std::_Vector_base<pairs_*,_std::allocator<pairs_*>_>::~_Vector_base
                    (&local_50.buffer.super__Vector_base<pairs_*,_std::allocator<pairs_*>_>);
        }
      }
      std::_Vector_base<Sstable_*,_std::allocator<Sstable_*>_>::~_Vector_base
                (&local_98.file.super__Vector_base<Sstable_*,_std::allocator<Sstable_*>_>);
      uVar7 = local_c0 + 1;
    }
    bVar4 = (byte)uVar5;
    if (!bVar2) {
      bVar4 = 0;
      goto LAB_001052c4;
    }
  }
  bVar4 = bVar4 ^ 1;
LAB_001052c4:
  std::__cxx11::string::~string((string *)&local_70);
  return (bool)(bVar4 & 1);
}

Assistant:

bool LSM_tree::find(uint64_t key) {
    //-----------------------------------先去memtable里找--------------------------//

    //声明：如果memtable里存了一个标记被删了的pair 那么memtable.get是会返回NULL的 也就是没找到
//    if ((memtable.get(key)) != nullptr) {
//        return true;
//    }
    std::string result;
//    if ((result = memtable.get(key)) != nullptr) {
//        return *result;
//    }
    bool del = false;
    bool has_key = memtable.has_key(key, del, result);
    if (has_key) {
        if (del) {
            return false;
        } else
            return true;
    }

    bool has = false;
    unsigned int ans_timer = 0;
    bool ans_del = false;
    for (int i = 0; i < disk.size(); i++) {

        if (disk.size() == 0) return false;
        //每层里 一个文件一个文件找 -----在索引里
        Level level = *disk[i];
        for (int j = 0; j < level.file.size(); j++) {
            if (level.file[j] == nullptr) continue;
            Sstable sstable = *(level.file[j]);

            pairs temp(0, 0, 0, false);

            //标记为删了的不能返回true哦！
            int id = 0;

            bool is_find = sstable.find(key, temp, id);

            if (is_find) {
                has = true;
                if (temp.timer > ans_timer) {
                    ans_timer = temp.timer;
                    ans_del = temp.del;

                }

            }

        }
    }

    if (!has) {
        return false;
    } else {
        if (ans_del) return false;
        return true;

    }


}